

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

int __thiscall
CRegexSearcher::match_pattern
          (CRegexSearcher *this,re_compiled_pattern *pattern,char *entirestr,char *searchstr,
          size_t searchlen,re_group_register *regs)

{
  int iVar1;
  short loop_vars [20];
  
  iVar1 = match(this,entirestr,(size_t)(searchstr + (searchlen - (long)entirestr)),searchstr,
                searchlen,&pattern->super_re_compiled_pattern_base,pattern->tuples,
                (re_machine *)pattern,regs,loop_vars);
  return iVar1;
}

Assistant:

int CRegexSearcher::match_pattern(
    const re_compiled_pattern *pattern,
    const char *entirestr, const char *searchstr, size_t searchlen, 
    re_group_register *regs)
{
    short loop_vars[RE_LOOP_VARS_MAX];

    /* match the string */
    return match(entirestr, searchlen + (searchstr - entirestr),
                 searchstr, searchlen,
                 pattern, pattern->tuples, &pattern->machine,
                 regs, loop_vars);
}